

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O3

void __thiscall
AnalyserExternalVariable_removeDependencyByPointer_Test::TestBody
          (AnalyserExternalVariable_removeDependencyByPointer_Test *this)

{
  char cVar1;
  string sVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AnalyserExternalVariablePtr externalVariable;
  VariablePtr dummy;
  ModelPtr model;
  ParserPtr parser;
  AssertHelper local_b0 [8];
  long *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  AssertionResult local_98;
  long local_88 [2];
  long *local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68 [2];
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_98);
  libcellml::Parser::parseModel(local_38);
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_78 = (long *)0x0;
  local_58 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_78,
             (unsigned_long *)&local_58);
  if ((string)local_98.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_98.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_98.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (((local_78 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
       (local_78 != (long *)0x0)) {
      (**(code **)(*local_78 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar2 = local_38[0];
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"membrane","");
  libcellml::ComponentEntity::component((string *)&local_a8,(bool)sVar2);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"V","");
  libcellml::Component::variable(local_48);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_58);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"membrane","");
  libcellml::ComponentEntity::component((string *)&local_a8,(bool)local_38[0]);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Cm","");
  libcellml::Component::variable(local_48);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  cVar1 = libcellml::AnalyserExternalVariable::removeDependency(local_58);
  local_78 = (long *)(CONCAT71(local_78._1_7_,cVar1) ^ 1);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(char *)&local_78,"externalVariable->removeDependency(dummy)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0x88,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if ((long *)local_98._0_8_ != local_88) {
      operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    }
    if (((local_a8 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
       (local_a8 != (long *)0x0)) {
      (**(code **)(*local_a8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::AnalyserExternalVariable::addDependency(local_58);
  sVar2 = (string)libcellml::AnalyserExternalVariable::removeDependency(local_58);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78._0_1_ = sVar2;
  if (sVar2 == (string)0x0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(char *)&local_78,"externalVariable->removeDependency(dummy)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0x8c,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if ((long *)local_98._0_8_ != local_88) {
      operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    }
    if (((local_a8 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
       (local_a8 != (long *)0x0)) {
      (**(code **)(*local_a8 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98._0_8_ = (long *)0x0;
  local_98.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cVar1 = libcellml::AnalyserExternalVariable::removeDependency(local_58);
  local_78 = (long *)(CONCAT71(local_78._1_7_,cVar1) ^ 1);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar1 == '\0') goto LAB_0012ab6f;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.message_.ptr_);
    if (((ulong)local_78 & 1) != 0) goto LAB_0012ab6f;
  }
  testing::Message::Message((Message *)&local_a8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_98,(char *)&local_78,"externalVariable->removeDependency(nullptr)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
             ,0x8d,(char *)local_98._0_8_);
  testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
  testing::internal::AssertHelper::~AssertHelper(local_b0);
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  if (((local_a8 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
     (local_a8 != (long *)0x0)) {
    (**(code **)(*local_a8 + 8))();
  }
LAB_0012ab6f:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(AnalyserExternalVariable, removeDependencyByPointer)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));
    auto dummy = model->component("membrane")->variable("Cm");

    EXPECT_FALSE(externalVariable->removeDependency(dummy));

    externalVariable->addDependency(dummy);

    EXPECT_TRUE(externalVariable->removeDependency(dummy));
    EXPECT_FALSE(externalVariable->removeDependency(nullptr));
}